

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O0

int handle_timeo(long currcms)

{
  bool bVar1;
  long in_RDI;
  int force_redraw;
  int j;
  int i;
  long in_stack_ffffffffffffffc0;
  int local_20;
  int local_1c;
  
  bVar1 = false;
  if (clearscreen != 0) {
    in_stack_ffffffffffffffc0 = timeout;
    if (print_eff == 0) {
      printf("%s%sXX|ms%sID %sdata ...     < %s %c l=%ld h=%ld t=%ld slots=%d >","\x1b[2J","\x1b[H",
             ldl,ldl,interface,(uint)name_sep,loop,hold,timeout,idx);
    }
    else {
      printf("%s%sXX|ms%s-- ID --%sdata ...     < %s %c l=%ld h=%ld t=%ld slots=%d >","\x1b[2J",
             "\x1b[H",vdl,vdl,interface,(uint)name_sep,loop,hold,timeout,idx);
    }
    bVar1 = true;
    clearscreen = 0;
  }
  if (notch != 0) {
    for (local_1c = 0; local_1c < idx; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < max_dlen; local_20 = local_20 + 1) {
        *(byte *)((long)local_1c * 0x158 + 0x108298 + (long)local_20) =
             *(byte *)((long)local_1c * 0x158 + 0x108298 + (long)local_20) |
             *(byte *)((long)local_1c * 0x158 + 0x108250 + (long)local_20);
      }
    }
    notch = 0;
  }
  printf("%s","\x1b[H");
  handle_timeo::frame_count = handle_timeo::frame_count + 1;
  printf("%02d\n");
  handle_timeo::frame_count = handle_timeo::frame_count % 100;
  for (local_1c = 0; local_1c < idx; local_1c = local_1c + 1) {
    if ((sniftab[local_1c].flags & 1U) != 0) {
      if ((sniftab[local_1c].flags & 2U) != 0) {
        if (((sniftab[local_1c].flags & 4U) != 0) || (bVar1)) {
          print_snifline((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
          sniftab[local_1c].hold = in_RDI + hold;
          sniftab[local_1c].flags = sniftab[local_1c].flags & 0xfffffffb;
        }
        else if ((sniftab[local_1c].hold == 0) || (in_RDI <= sniftab[local_1c].hold)) {
          printf("%s","\x1b[B");
        }
        else {
          memset(sniftab[local_1c].marker.data,0,(long)max_dlen);
          print_snifline((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
          sniftab[local_1c].hold = 0;
        }
        if ((sniftab[local_1c].timeout != 0) && (sniftab[local_1c].timeout < in_RDI)) {
          sniftab[local_1c].flags = sniftab[local_1c].flags & 0xfffffffd;
          sniftab[local_1c].flags = sniftab[local_1c].flags & 0xfffffffb;
          clearscreen = 1;
        }
      }
      memcpy(&sniftab[local_1c].last,&sniftab[local_1c].current,0x48);
    }
  }
  return 1;
}

Assistant:

int handle_timeo(long currcms)
{
	int i, j;
	int force_redraw = 0;
	static unsigned int frame_count;

	if (clearscreen) {
		if (print_eff)
			printf("%s%sXX|ms%s-- ID --%sdata ...     < %s %c l=%ld h=%ld t=%ld slots=%d >",
			       CLR_SCREEN, CSR_HOME, vdl, vdl, interface, name_sep, loop, hold, timeout, idx);
		else
			printf("%s%sXX|ms%sID %sdata ...     < %s %c l=%ld h=%ld t=%ld slots=%d >",
			       CLR_SCREEN, CSR_HOME, ldl, ldl, interface, name_sep, loop, hold, timeout, idx);

		force_redraw = 1;
		clearscreen = 0;
	}

	if (notch) {
		for (i = 0; i < idx; i++) {
			for (j = 0; j < max_dlen; j++)
				sniftab[i].notch.data[j] |= sniftab[i].marker.data[j];
		}
		notch = 0;
	}

	printf("%s", CSR_HOME);
	printf("%02d\n", frame_count++); /* rolling display update counter */
	frame_count %= 100;

	for (i = 0; i < idx; i++) {
		if is_set(i, ENABLE) {
				if is_set(i, DISPLAY) {
						if (is_set(i, UPDATE) || (force_redraw)) {
							print_snifline(i);
							sniftab[i].hold = currcms + hold;
							do_clr(i, UPDATE);
						}
						else  if ((sniftab[i].hold) && (sniftab[i].hold < currcms)) {
								memset(&sniftab[i].marker.data, 0, max_dlen);
								print_snifline(i);
								sniftab[i].hold = 0; /* disable update by hold */
							}
						else
							printf("%s", CSR_DOWN); /* skip my line */

						if (sniftab[i].timeout && sniftab[i].timeout < currcms) {
							do_clr(i, DISPLAY);
							do_clr(i, UPDATE);
							clearscreen = 1; /* removed entry -> new drawing next time */
						}
					}
				sniftab[i].last      = sniftab[i].current;
			}
	}

	return 1; /* ok */
}